

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O1

void __thiscall CHud::RenderSpectatorHud(CHud *this)

{
  int ID;
  int iVar1;
  CGameClient *pCVar2;
  ITextRender *pIVar3;
  vec2 CursorPosition;
  int iVar4;
  char *pcVar5;
  vec4 *pvVar6;
  long in_FS_OFFSET;
  float fVar7;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar8;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar9;
  CTextBoundingBox CVar10;
  CUIRect Rect;
  char aFlag [64];
  char aBuf [128];
  vec4 local_118;
  CUIRect local_108;
  vec4 local_f8 [4];
  vec4 local_b8 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = (this->super_CComponent).m_pClient;
  ID = (pCVar2->m_Snap).m_SpecInfo.m_SpectatorID;
  iVar1 = (pCVar2->m_Snap).m_SpecInfo.m_SpecMode;
  fVar7 = this->m_Width * 0.25 + -2.0;
  local_108.x = this->m_Width - fVar7;
  local_108.y = this->m_Height + -15.0;
  local_108.h = 15.0;
  local_b8[0].field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x0;
  local_b8[0].field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x0;
  local_b8[0].field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x0;
  local_b8[0].field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3ecccccd;
  local_108.w = fVar7;
  CUIRect::Draw(&local_108,local_f8 + 4,5.0,1);
  pCVar2 = (this->super_CComponent).m_pClient;
  pvVar6 = (vec4 *)(pCVar2->m_aClients + ID);
  if ((long)ID == -1) {
    pvVar6 = (vec4 *)0x1e33dc;
  }
  if (pCVar2->m_pConfig->m_ClShowsocial == 0) {
    pvVar6 = (vec4 *)0x1e33dc;
  }
  if ((RenderSpectatorHud()::s_SpectateLabelCursor == '\0') &&
     (iVar4 = __cxa_guard_acquire(&RenderSpectatorHud()::s_SpectateLabelCursor), iVar4 != 0)) {
    CTextCursor::CTextCursor(&RenderSpectatorHud::s_SpectateLabelCursor,8.0,0);
    __cxa_atexit(CTextCursor::~CTextCursor,&RenderSpectatorHud::s_SpectateLabelCursor,&__dso_handle)
    ;
    __cxa_guard_release(&RenderSpectatorHud()::s_SpectateLabelCursor);
  }
  RenderSpectatorHud::s_SpectateLabelCursor.m_CursorPos.field_1.y = this->m_Height + -13.0;
  RenderSpectatorHud::s_SpectateLabelCursor.m_CursorPos.field_0.x = (this->m_Width - fVar7) + 6.0;
  CTextCursor::Reset(&RenderSpectatorHud::s_SpectateLabelCursor,
                     (long)g_Localization.m_CurrentVersion);
  pcVar5 = Localize("Spectate","");
  str_format((char *)(local_f8 + 4),0x80,"%s: ",pcVar5);
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0xb])
            (pIVar3,&RenderSpectatorHud::s_SpectateLabelCursor,local_f8 + 4,0xffffffff);
  if ((RenderSpectatorHud()::s_SpectateTargetCursor == '\0') &&
     (iVar4 = __cxa_guard_acquire(&RenderSpectatorHud()::s_SpectateTargetCursor), iVar4 != 0)) {
    CTextCursor::CTextCursor(&RenderSpectatorHud::s_SpectateTargetCursor,8.0,0);
    __cxa_atexit(CTextCursor::~CTextCursor,&RenderSpectatorHud::s_SpectateTargetCursor,&__dso_handle
                );
    __cxa_guard_release(&RenderSpectatorHud()::s_SpectateTargetCursor);
  }
  CTextCursor::Reset(&RenderSpectatorHud::s_SpectateTargetCursor,-1);
  if (iVar1 - 2U < 2) {
    pcVar5 = "Blue Flag";
    if (iVar1 == 2) {
      pcVar5 = "Red Flag";
    }
    pcVar5 = Localize(pcVar5,"");
    str_format((char *)local_f8,0x40,pcVar5);
    if (ID != -1) {
      str_format((char *)(local_f8 + 4),0x80,"%s (%s)",local_f8,pvVar6);
      goto LAB_00148346;
    }
    pvVar6 = local_f8;
  }
  else if (iVar1 == 0) {
    pvVar6 = (vec4 *)Localize("Free-View","");
  }
  else if (iVar1 != 1) goto LAB_00148346;
  str_format((char *)(local_f8 + 4),0x80,"%s",pvVar6);
LAB_00148346:
  CVar10 = CTextCursor::AlignedBoundingBox(&RenderSpectatorHud::s_SpectateLabelCursor);
  aVar8.x = CVar10.x + RenderSpectatorHud::s_SpectateLabelCursor.m_CursorPos.field_0.x + CVar10.w +
            3.0;
  aVar9.y = this->m_Height + -13.0;
  if (iVar1 == 1 || ID != -1) {
    local_f8[0].field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
    local_f8[0].field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
    local_f8[0].field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
    local_f8[0].field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f000000;
    local_118.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3dcccccd;
    local_118.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3dcccccd;
    local_118.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3dcccccd;
    local_118.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
    CursorPosition.field_1.y = aVar9.y;
    CursorPosition.field_0.x = aVar8.x;
    fVar7 = CUI::DrawClientID(&((this->super_CComponent).m_pClient)->m_UI,
                              RenderSpectatorHud::s_SpectateTargetCursor.m_FontSize,CursorPosition,
                              ID,local_f8,&local_118);
    aVar8.x = aVar8.x + fVar7;
  }
  RenderSpectatorHud::s_SpectateTargetCursor.m_CursorPos.field_1.y = aVar9.y;
  RenderSpectatorHud::s_SpectateTargetCursor.m_CursorPos.field_0.x = aVar8.x;
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0xb])
            (pIVar3,&RenderSpectatorHud::s_SpectateTargetCursor,local_f8 + 4,0xffffffff);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CHud::RenderSpectatorHud()
{
	const int SpecID = m_pClient->m_Snap.m_SpecInfo.m_SpectatorID;
	const int SpecMode = m_pClient->m_Snap.m_SpecInfo.m_SpecMode;

	// draw the box
	const float Width = m_Width * 0.25f - 2.0f;
	CUIRect Rect = {m_Width-Width, m_Height-15.0f, Width, 15.0f};
	Rect.Draw(vec4(0.0f, 0.0f, 0.0f, 0.4f), 5.0f, CUIRect::CORNER_TL);

	// draw the text
	const char *pName = Config()->m_ClShowsocial && SpecID != -1 ? m_pClient->m_aClients[SpecID].m_aName : "";
	char aBuf[128];

	static CTextCursor s_SpectateLabelCursor(8.0f);
	s_SpectateLabelCursor.MoveTo(m_Width-Width+6.0f, m_Height-13.0f);
	s_SpectateLabelCursor.Reset(g_Localization.Version());
	str_format(aBuf, sizeof(aBuf), "%s: ", Localize("Spectate"));
	TextRender()->TextOutlined(&s_SpectateLabelCursor, aBuf, -1);

	static CTextCursor s_SpectateTargetCursor(8.0f);
	s_SpectateTargetCursor.Reset();

	switch(SpecMode)
	{
	case SPEC_FREEVIEW:
		str_format(aBuf, sizeof(aBuf), "%s", Localize("Free-View"));
		break;
	case SPEC_PLAYER:
		str_format(aBuf, sizeof(aBuf), "%s", pName);
		break;
	case SPEC_FLAGRED:
	case SPEC_FLAGBLUE:
		char aFlag[64];
		str_format(aFlag, sizeof(aFlag), SpecMode == SPEC_FLAGRED ? Localize("Red Flag") : Localize("Blue Flag"));

		if(SpecID != -1)
			str_format(aBuf, sizeof(aBuf), "%s (%s)", aFlag, pName);
		else
			str_format(aBuf, sizeof(aBuf), "%s", aFlag);
		break;
	}

	vec2 NamePosition = vec2(s_SpectateLabelCursor.BoundingBox().Right()+3.0f, m_Height-13.0f);
	if(SpecMode == SPEC_PLAYER || SpecID != -1)
		NamePosition.x += UI()->DrawClientID(s_SpectateTargetCursor.m_FontSize, NamePosition, SpecID);

	s_SpectateTargetCursor.MoveTo(NamePosition.x, NamePosition.y);
	TextRender()->TextOutlined(&s_SpectateTargetCursor, aBuf, -1);
}